

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_intervals_test.cpp
# Opt level: O0

void check_compute_persistent_betti_numbers_invoker(void)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char local_8d1;
  basic_wrap_stringstream<char> local_8d0;
  basic_cstring<const_char> local_738;
  basic_cstring<const_char> local_728;
  char local_711;
  basic_wrap_stringstream<char> local_710;
  basic_cstring<const_char> local_578;
  basic_cstring<const_char> local_568;
  char local_551;
  basic_wrap_stringstream<char> local_550;
  basic_cstring<const_char> local_3b8;
  basic_cstring<const_char> local_3a8;
  char local_391;
  basic_wrap_stringstream<char> local_390;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  check_compute_persistent_betti_numbers local_1d5 [8];
  check_compute_persistent_betti_numbers t;
  char local_1c1;
  basic_wrap_stringstream<char> local_1c0;
  basic_cstring<const_char> local_28;
  basic_cstring<const_char> local_18;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_intervals_test.cpp"
             ,0x89);
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_1c0);
  local_1c1 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_1c1);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [39])"check_compute_persistent_betti_numbers");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_28,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_18,0x6b,&local_28);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_intervals_test.cpp"
             ,0x89);
  memset(&local_390,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_390);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_390);
  local_391 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_391);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [39])"check_compute_persistent_betti_numbers");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [16])"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f8,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e8,0x6b,&local_1f8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_390);
  boost::unit_test::setup_conditional<check_compute_persistent_betti_numbers>(local_1d5);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3a8,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_intervals_test.cpp"
             ,0x89);
  memset(&local_550,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_550);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_550);
  local_551 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_551);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [39])"check_compute_persistent_betti_numbers");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [13])"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3b8,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3a8,0x6b,&local_3b8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_550);
  check_compute_persistent_betti_numbers::test_method(local_1d5);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_568,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_intervals_test.cpp"
             ,0x89);
  memset(&local_710,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_710);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_710);
  local_711 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_711);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [39])"check_compute_persistent_betti_numbers");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [19])"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_578,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_568,0x6b,&local_578);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_710);
  boost::unit_test::teardown_conditional<check_compute_persistent_betti_numbers>(local_1d5);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_728,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_intervals_test.cpp"
             ,0x89);
  memset(&local_8d0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_8d0);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_8d0);
  local_8d1 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_8d1);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [39])"check_compute_persistent_betti_numbers");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_738,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_728,0x6b,&local_738);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_8d0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_compute_persistent_betti_numbers) {
  Persistence_intervals p("data/file_with_diagram");
  std::vector<std::pair<double, size_t> > pbns{ {0.0290362, 1}, {0.0307676, 2}, {0.0366312, 3}, {0.0544614, 4},
                                                {0.0920033, 5}, {0.104599, 6}, {0.114718, 7}, {0.117379, 8},
                                                {0.123493, 9}, {0.133638, 10}, {0.137798, 9}, {0.149798, 10},
                                                {0.155421, 11}, {0.158443, 12}, {0.176956, 13}, {0.183234, 12},
                                                {0.191069, 13}, {0.191333, 14}, {0.191836, 15}, {0.192675, 16},
                                                {0.208564, 17}, {0.218425, 18}, {0.219902, 17}, {0.23233, 16},
                                                {0.234558, 17}, {0.237166, 16}, {0.247352, 17}, {0.267421, 18},
                                                {0.268093, 19}, {0.278734, 18}, {0.284722, 19}, {0.284998, 20},
                                                {0.294069, 21}, {0.306293, 22}, {0.322361, 21}, {0.323152, 22},
                                                {0.371021, 23}, {0.372395, 24}, {0.387744, 25}, {0.435537, 26},
                                                {0.462911, 25}, {0.483569, 26}, {0.489209, 25}, {0.517115, 24},
                                                {0.522197, 23}, {0.532665, 22}, {0.545262, 23}, {0.587227, 22},
                                                {0.593036, 23}, {0.602647, 24}, {0.605044, 25}, {0.621962, 24},
                                                {0.629449, 23}, {0.636719, 22}, {0.64957, 21}, {0.650781, 22},
                                                {0.654951, 23}, {0.683489, 24}, {0.687172, 23}, {0.69703, 22},
                                                {0.701174, 21}, {0.717623, 22}, {0.722023, 21}, {0.722298, 20},
                                                {0.725347, 19}, {0.73071, 18}, {0.758355, 17}, {0.770913, 18},
                                                {0.790833, 17}, {0.821211, 16}, {0.849305, 17}, {0.853669, 16},
                                                {0.866659, 15}, {0.872896, 16}, {0.889597, 15}, {0.900231, 14},
                                                {0.903847, 13}, {0.906299, 12}, {0.910852, 11}, {0.93453, 10},
                                                {0.944757, 9}, {0.947812, 8}, {0.959154, 7}, {0.975654, 6},
                                                {0.976719, 5}, {0.977343, 4}, {0.980129, 3}, {0.987842, 2},
                                                {0.990127, 1}, {0.994537, 0} };

  std::vector<std::pair<double, size_t> > pbns_new = p.compute_persistent_betti_numbers();
  for (size_t i = 0; i != pbns.size(); ++i) {
    GUDHI_TEST_FLOAT_EQUALITY_CHECK(pbns[i].first, pbns_new[i].first, Gudhi::Persistence_representations::epsi);
    BOOST_CHECK(pbns[i].second == pbns_new[i].second);
  }
}